

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ecf33::BuildSystemFileDelegate::cannotLoadDueToMultipleProducers
          (BuildSystemFileDelegate *this,Node *output,
          vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
          *commands)

{
  vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_> *pvVar1;
  BuildSystemDelegate *pBVar2;
  vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_> local_38
  ;
  vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
  *local_20;
  vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
  *commands_local;
  Node *output_local;
  BuildSystemFileDelegate *this_local;
  
  local_20 = commands;
  commands_local =
       (vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_> *)
       output;
  output_local = (Node *)this;
  pBVar2 = getSystemDelegate(this);
  pvVar1 = commands_local;
  std::vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>::
  vector(&local_38,commands);
  (*pBVar2->_vptr_BuildSystemDelegate[0x12])(pBVar2,pvVar1,&local_38);
  std::vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>::
  ~vector(&local_38);
  return;
}

Assistant:

void
BuildSystemFileDelegate::cannotLoadDueToMultipleProducers(Node *output,
                                                          std::vector<Command*> commands) {
  getSystemDelegate().cannotBuildNodeDueToMultipleProducers(output, commands);
}